

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigMan.c
# Opt level: O0

Fraig_NodeVec_t * Fraig_ManGetSimInfo(Fraig_Man_t *p)

{
  Fraig_Node_t *pFVar1;
  Fraig_Node_t *pFVar2;
  int iVar3;
  int iVar4;
  Fraig_NodeVec_t *pFVar5;
  int local_38;
  int nWords;
  int k;
  int i;
  int nDynamic;
  int nRandom;
  uint *pUnsigned;
  Fraig_Node_t *pNode;
  Fraig_NodeVec_t *vInfo;
  Fraig_Man_t *p_local;
  
  iVar3 = Fraig_ManReadPatternNumRandom(p);
  iVar4 = Fraig_ManReadPatternNumDynamic(p);
  pFVar5 = Fraig_UtilInfoAlloc(p->vNodes->nSize,iVar3 / 0x20 + iVar4 / 0x20,0);
  nWords = 0;
  while( true ) {
    if (p->vNodes->nSize <= nWords) {
      return pFVar5;
    }
    pFVar1 = p->vNodes->pArray[nWords];
    if (nWords != pFVar1->Num) break;
    pFVar2 = pFVar5->pArray[nWords];
    for (local_38 = 0; local_38 < iVar3 / 0x20; local_38 = local_38 + 1) {
      (&pFVar2->Num)[local_38] = pFVar1->puSimR[local_38];
    }
    for (local_38 = 0; local_38 < iVar4 / 0x20; local_38 = local_38 + 1) {
      (&pFVar2->Num)[iVar3 / 0x20 + local_38] = pFVar1->puSimD[local_38];
    }
    nWords = nWords + 1;
  }
  __assert_fail("i == pNode->Num",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fraig/fraigMan.c"
                ,0x1b1,"Fraig_NodeVec_t *Fraig_ManGetSimInfo(Fraig_Man_t *)");
}

Assistant:

Fraig_NodeVec_t * Fraig_ManGetSimInfo( Fraig_Man_t * p )
{
    Fraig_NodeVec_t * vInfo;
    Fraig_Node_t * pNode;
    unsigned * pUnsigned;
    int nRandom, nDynamic;
    int i, k, nWords;

    nRandom  = Fraig_ManReadPatternNumRandom( p );
    nDynamic = Fraig_ManReadPatternNumDynamic( p );
    nWords = nRandom / 32 + nDynamic / 32;

    vInfo = Fraig_UtilInfoAlloc( p->vNodes->nSize, nWords, 0 );
    for ( i = 0; i < p->vNodes->nSize; i++ )
    {
        pNode = p->vNodes->pArray[i];
        assert( i == pNode->Num );
        pUnsigned = (unsigned *)vInfo->pArray[i];
        for ( k = 0; k < nRandom / 32; k++ )
            pUnsigned[k] = pNode->puSimR[k];
        for ( k = 0; k < nDynamic / 32; k++ )
            pUnsigned[nRandom / 32 + k] = pNode->puSimD[k];
    }
    return vInfo;
}